

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O0

int coda_cursor_has_ascii_content(coda_cursor *cursor,int *has_ascii_content)

{
  int iVar1;
  bool local_341;
  coda_type *local_340;
  undefined1 local_338 [8];
  coda_cursor sub_cursor;
  coda_type *type;
  int *has_ascii_content_local;
  coda_cursor *cursor_local;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (cursor->stack[cursor->n + -1].type == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x5c0);
    cursor_local._4_4_ = -1;
  }
  else if (has_ascii_content == (int *)0x0) {
    coda_set_error(-100,"has_ascii_content argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x5c5);
    cursor_local._4_4_ = -1;
  }
  else {
    if ((cursor->stack[cursor->n + -1].type)->backend == coda_backend_ascii) {
      *has_ascii_content = 1;
    }
    else {
      if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
        local_340 = (coda_type *)cursor->stack[cursor->n + -1].type;
      }
      else {
        local_340 = (cursor->stack[cursor->n + -1].type)->definition;
      }
      sub_cursor.stack[0x1f].bit_offset = (int64_t)local_340;
      if (local_340->type_class == 6) {
        memcpy(local_338,cursor,0x310);
        iVar1 = coda_cursor_use_base_type_of_special_type((coda_cursor *)local_338);
        if (iVar1 != 0) {
          return -1;
        }
        iVar1 = coda_cursor_has_ascii_content((coda_cursor *)local_338,has_ascii_content);
        return iVar1;
      }
      local_341 = true;
      if (local_340->format != coda_backend_ascii) {
        local_341 = local_340->type_class == 4;
      }
      *has_ascii_content = (uint)local_341;
    }
    cursor_local._4_4_ = 0;
  }
  return cursor_local._4_4_;
}

Assistant:

LIBCODA_API int coda_cursor_has_ascii_content(const coda_cursor *cursor, int *has_ascii_content)
{
    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (has_ascii_content == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "has_ascii_content argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
            *has_ascii_content = 1;
            break;
        default:
            {
                coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

                if (type->type_class == coda_special_class)
                {
                    coda_cursor sub_cursor = *cursor;

                    if (coda_cursor_use_base_type_of_special_type(&sub_cursor) != 0)
                    {
                        return -1;
                    }
                    return coda_cursor_has_ascii_content(&sub_cursor, has_ascii_content);
                }
                *has_ascii_content = (type->format == coda_format_ascii || type->type_class == coda_text_class);
            }
            break;
    }
    return 0;
}